

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBoxAlgo.cpp
# Opt level: O0

void anon_unknown.dwarf_355c8::rayBoxIntersection2(void)

{
  ostream *this;
  bool b;
  V3f ip;
  Line3f ray;
  Box3f box;
  undefined2 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1a;
  undefined1 uVar1;
  undefined1 in_stack_fffffffffffffd1b;
  undefined1 uVar2;
  undefined1 in_stack_fffffffffffffd1c;
  undefined1 uVar3;
  undefined1 in_stack_fffffffffffffd1d;
  undefined1 uVar4;
  undefined1 in_stack_fffffffffffffd1e;
  undefined1 uVar5;
  undefined1 in_stack_fffffffffffffd1f;
  undefined1 uVar6;
  Line3<float> *in_stack_fffffffffffffd20;
  Vec3<float> *in_stack_fffffffffffffd28;
  Box<Imath_3_2::Vec3<float>_> *in_stack_fffffffffffffd30;
  Vec3<float> local_2b0;
  Vec3<float> local_2a4 [2];
  undefined1 in_stack_fffffffffffffd77;
  Line3f *in_stack_fffffffffffffd78;
  Box3f *in_stack_fffffffffffffd80;
  Vec3<float> local_274;
  Vec3<float> *in_stack_fffffffffffffd98;
  Line3<float> *in_stack_fffffffffffffda0;
  Box<Imath_3_2::Vec3<float>_> *in_stack_fffffffffffffda8;
  Vec3<float> local_244;
  Vec3<float> local_238;
  Vec3<float> local_22c [3];
  Vec3<float> local_208;
  Vec3<float> local_1fc [3];
  Vec3<float> local_1d8;
  Vec3<float> local_1cc [3];
  Vec3<float> local_1a8;
  Vec3<float> local_19c;
  Vec3<float> local_190 [3];
  Vec3<float> local_16c;
  Vec3<float> local_160;
  Vec3<float> local_154 [3];
  Vec3<float> local_130;
  Vec3<float> local_124 [3];
  Vec3<float> local_100;
  Vec3<float> local_f4 [3];
  Vec3<float> local_d0;
  Vec3<float> local_c4;
  Vec3<float> local_b8 [3];
  Vec3<float> local_94;
  Vec3<float> local_88;
  Vec3<float> local_7c [3];
  undefined1 local_55;
  Vec3<float> local_54 [3];
  Vec3<float> local_30;
  Vec3<float> local_24 [3];
  
  this = std::operator<<((ostream *)&std::cout,"  ray-box intersection, nearly axis-parallel rays");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Vec3<float>::Vec3(local_24,-1e+15,-1e+15,-1e+15);
  Imath_3_2::Vec3<float>::Vec3(&local_30,1e+15,1e+15,1e+15);
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::Box
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,&in_stack_fffffffffffffd20->pos);
  Imath_3_2::Line3<float>::Line3(in_stack_fffffffffffffd20);
  Imath_3_2::Vec3<float>::Vec3(local_54);
  Imath_3_2::Vec3<float>::Vec3(local_7c,-2e+15,0.0,0.0);
  Imath_3_2::Vec3<float>::Vec3(&local_88,2e+15,0.0,0.0);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             &in_stack_fffffffffffffd20->pos);
  Imath_3_2::Line3<float>::operator=
            (in_stack_fffffffffffffd20,
             (Line3<float> *)
             CONCAT17(in_stack_fffffffffffffd1f,
                      CONCAT16(in_stack_fffffffffffffd1e,
                               CONCAT15(in_stack_fffffffffffffd1d,
                                        CONCAT14(in_stack_fffffffffffffd1c,
                                                 CONCAT13(in_stack_fffffffffffffd1b,
                                                          CONCAT12(in_stack_fffffffffffffd1a,
                                                                   in_stack_fffffffffffffd18)))))));
  local_55 = Imath_3_2::intersects<float>
                       (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                        in_stack_fffffffffffffd98);
  uVar6 = false;
  if ((bool)local_55) {
    Imath_3_2::Vec3<float>::Vec3(&local_94,-1e+15,0.0,0.0);
    uVar6 = Imath_3_2::Vec3<float>::operator==(local_54,&local_94);
  }
  if ((bool)uVar6 == false) {
    __assert_fail("b && ip == V3f (-1e15f, 0, 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                  ,0x2d5,"void (anonymous namespace)::rayBoxIntersection2()");
  }
  testPerturbedRayBox(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                      (bool)in_stack_fffffffffffffd77);
  Imath_3_2::Vec3<float>::Vec3(local_b8,2e+15,0.0,0.0);
  Imath_3_2::Vec3<float>::Vec3(&local_c4,-2e+15,0.0,0.0);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             &in_stack_fffffffffffffd20->pos);
  Imath_3_2::Line3<float>::operator=
            (in_stack_fffffffffffffd20,
             (Line3<float> *)
             CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd1e,
                                     CONCAT15(in_stack_fffffffffffffd1d,
                                              CONCAT14(in_stack_fffffffffffffd1c,
                                                       CONCAT13(in_stack_fffffffffffffd1b,
                                                                CONCAT12(in_stack_fffffffffffffd1a,
                                                                         in_stack_fffffffffffffd18))
                                                      )))));
  local_55 = Imath_3_2::intersects<float>
                       (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                        in_stack_fffffffffffffd98);
  uVar5 = false;
  if ((bool)local_55) {
    Imath_3_2::Vec3<float>::Vec3(&local_d0,1e+15,0.0,0.0);
    uVar5 = Imath_3_2::Vec3<float>::operator==(local_54,&local_d0);
  }
  if ((bool)uVar5 == false) {
    __assert_fail("b && ip == V3f (1e15f, 0, 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                  ,0x2da,"void (anonymous namespace)::rayBoxIntersection2()");
  }
  testPerturbedRayBox(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                      (bool)in_stack_fffffffffffffd77);
  Imath_3_2::Vec3<float>::Vec3(local_f4,-2e+15,2e+15,0.0);
  Imath_3_2::Vec3<float>::Vec3(&local_100,2e+15,2e+15,0.0);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             &in_stack_fffffffffffffd20->pos);
  Imath_3_2::Line3<float>::operator=
            (in_stack_fffffffffffffd20,
             (Line3<float> *)
             CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(in_stack_fffffffffffffd1d,
                                                    CONCAT14(in_stack_fffffffffffffd1c,
                                                             CONCAT13(in_stack_fffffffffffffd1b,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffd1a,
                                                  in_stack_fffffffffffffd18)))))));
  local_55 = Imath_3_2::intersects<float>
                       (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                        in_stack_fffffffffffffd98);
  if (((local_55 ^ 0xff) & 1) == 0) {
    __assert_fail("!b",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                  ,0x2df,"void (anonymous namespace)::rayBoxIntersection2()");
  }
  testPerturbedRayBox(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                      (bool)in_stack_fffffffffffffd77);
  Imath_3_2::Vec3<float>::Vec3(local_124,2e+15,2e+15,0.0);
  Imath_3_2::Vec3<float>::Vec3(&local_130,-2e+15,2e+15,0.0);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             &in_stack_fffffffffffffd20->pos);
  Imath_3_2::Line3<float>::operator=
            (in_stack_fffffffffffffd20,
             (Line3<float> *)
             CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(in_stack_fffffffffffffd1d,
                                                    CONCAT14(in_stack_fffffffffffffd1c,
                                                             CONCAT13(in_stack_fffffffffffffd1b,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffd1a,
                                                  in_stack_fffffffffffffd18)))))));
  local_55 = Imath_3_2::intersects<float>
                       (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                        in_stack_fffffffffffffd98);
  if (((local_55 ^ 0xff) & 1) == 0) {
    __assert_fail("!b",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                  ,0x2e4,"void (anonymous namespace)::rayBoxIntersection2()");
  }
  testPerturbedRayBox(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                      (bool)in_stack_fffffffffffffd77);
  Imath_3_2::Vec3<float>::Vec3(local_154,0.0,-2e+15,0.0);
  Imath_3_2::Vec3<float>::Vec3(&local_160,0.0,2e+15,0.0);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             &in_stack_fffffffffffffd20->pos);
  Imath_3_2::Line3<float>::operator=
            (in_stack_fffffffffffffd20,
             (Line3<float> *)
             CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(in_stack_fffffffffffffd1d,
                                                    CONCAT14(in_stack_fffffffffffffd1c,
                                                             CONCAT13(in_stack_fffffffffffffd1b,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffd1a,
                                                  in_stack_fffffffffffffd18)))))));
  local_55 = Imath_3_2::intersects<float>
                       (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                        in_stack_fffffffffffffd98);
  uVar4 = false;
  if ((bool)local_55) {
    Imath_3_2::Vec3<float>::Vec3(&local_16c,0.0,-1e+15,0.0);
    uVar4 = Imath_3_2::Vec3<float>::operator==(local_54,&local_16c);
  }
  if ((bool)uVar4 == false) {
    __assert_fail("b && ip == V3f (0, -1e15f, 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                  ,0x2e9,"void (anonymous namespace)::rayBoxIntersection2()");
  }
  testPerturbedRayBox(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                      (bool)in_stack_fffffffffffffd77);
  Imath_3_2::Vec3<float>::Vec3(local_190,0.0,2e+15,0.0);
  Imath_3_2::Vec3<float>::Vec3(&local_19c,0.0,-2e+15,0.0);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             &in_stack_fffffffffffffd20->pos);
  Imath_3_2::Line3<float>::operator=
            (in_stack_fffffffffffffd20,
             (Line3<float> *)
             CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(in_stack_fffffffffffffd1c,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffd1b,
                                                  CONCAT12(in_stack_fffffffffffffd1a,
                                                           in_stack_fffffffffffffd18)))))));
  local_55 = Imath_3_2::intersects<float>
                       (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                        in_stack_fffffffffffffd98);
  uVar3 = false;
  if ((bool)local_55) {
    Imath_3_2::Vec3<float>::Vec3(&local_1a8,0.0,1e+15,0.0);
    uVar3 = Imath_3_2::Vec3<float>::operator==(local_54,&local_1a8);
  }
  if ((bool)uVar3 == false) {
    __assert_fail("b && ip == V3f (0, 1e15f, 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                  ,0x2ee,"void (anonymous namespace)::rayBoxIntersection2()");
  }
  testPerturbedRayBox(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                      (bool)in_stack_fffffffffffffd77);
  Imath_3_2::Vec3<float>::Vec3(local_1cc,0.0,-2e+15,2e+15);
  Imath_3_2::Vec3<float>::Vec3(&local_1d8,0.0,2e+15,2e+15);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             &in_stack_fffffffffffffd20->pos);
  Imath_3_2::Line3<float>::operator=
            (in_stack_fffffffffffffd20,
             (Line3<float> *)
             CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar3,CONCAT13(
                                                  in_stack_fffffffffffffd1b,
                                                  CONCAT12(in_stack_fffffffffffffd1a,
                                                           in_stack_fffffffffffffd18)))))));
  local_55 = Imath_3_2::intersects<float>
                       (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                        in_stack_fffffffffffffd98);
  if (((local_55 ^ 0xff) & 1) == 0) {
    __assert_fail("!b",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                  ,0x2f3,"void (anonymous namespace)::rayBoxIntersection2()");
  }
  testPerturbedRayBox(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                      (bool)in_stack_fffffffffffffd77);
  Imath_3_2::Vec3<float>::Vec3(local_1fc,0.0,2e+15,2e+15);
  Imath_3_2::Vec3<float>::Vec3(&local_208,0.0,-2e+15,2e+15);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             &in_stack_fffffffffffffd20->pos);
  Imath_3_2::Line3<float>::operator=
            (in_stack_fffffffffffffd20,
             (Line3<float> *)
             CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar3,CONCAT13(
                                                  in_stack_fffffffffffffd1b,
                                                  CONCAT12(in_stack_fffffffffffffd1a,
                                                           in_stack_fffffffffffffd18)))))));
  local_55 = Imath_3_2::intersects<float>
                       (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                        in_stack_fffffffffffffd98);
  if (((local_55 ^ 0xff) & 1) == 0) {
    __assert_fail("!b",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                  ,0x2f8,"void (anonymous namespace)::rayBoxIntersection2()");
  }
  testPerturbedRayBox(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                      (bool)in_stack_fffffffffffffd77);
  Imath_3_2::Vec3<float>::Vec3(local_22c,0.0,0.0,-2e+15);
  Imath_3_2::Vec3<float>::Vec3(&local_238,0.0,0.0,2e+15);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             &in_stack_fffffffffffffd20->pos);
  Imath_3_2::Line3<float>::operator=
            (in_stack_fffffffffffffd20,
             (Line3<float> *)
             CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar3,CONCAT13(
                                                  in_stack_fffffffffffffd1b,
                                                  CONCAT12(in_stack_fffffffffffffd1a,
                                                           in_stack_fffffffffffffd18)))))));
  local_55 = Imath_3_2::intersects<float>
                       (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                        in_stack_fffffffffffffd98);
  uVar2 = false;
  if ((bool)local_55) {
    Imath_3_2::Vec3<float>::Vec3(&local_244,0.0,0.0,-1e+15);
    uVar2 = Imath_3_2::Vec3<float>::operator==(local_54,&local_244);
  }
  if ((bool)uVar2 == false) {
    __assert_fail("b && ip == V3f (0, 0, -1e15f)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                  ,0x2fd,"void (anonymous namespace)::rayBoxIntersection2()");
  }
  testPerturbedRayBox(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                      (bool)in_stack_fffffffffffffd77);
  Imath_3_2::Vec3<float>::Vec3((Vec3<float> *)&stack0xfffffffffffffd98,0.0,0.0,2e+15);
  Imath_3_2::Vec3<float>::Vec3(&local_274,0.0,0.0,-2e+15);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             &in_stack_fffffffffffffd20->pos);
  Imath_3_2::Line3<float>::operator=
            (in_stack_fffffffffffffd20,
             (Line3<float> *)
             CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar3,CONCAT13(uVar2,CONCAT12(
                                                  in_stack_fffffffffffffd1a,
                                                  in_stack_fffffffffffffd18)))))));
  local_55 = Imath_3_2::intersects<float>
                       (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                        in_stack_fffffffffffffd98);
  uVar1 = false;
  if ((bool)local_55) {
    Imath_3_2::Vec3<float>::Vec3((Vec3<float> *)&stack0xfffffffffffffd80,0.0,0.0,1e+15);
    uVar1 = Imath_3_2::Vec3<float>::operator==(local_54,(Vec3<float> *)&stack0xfffffffffffffd80);
  }
  if ((bool)uVar1 == false) {
    __assert_fail("b && ip == V3f (0, 0, 1e15f)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                  ,0x302,"void (anonymous namespace)::rayBoxIntersection2()");
  }
  testPerturbedRayBox(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                      (bool)in_stack_fffffffffffffd77);
  Imath_3_2::Vec3<float>::Vec3(local_2a4,2e+15,0.0,-2e+15);
  Imath_3_2::Vec3<float>::Vec3(&local_2b0,2e+15,0.0,2e+15);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             &in_stack_fffffffffffffd20->pos);
  Imath_3_2::Line3<float>::operator=
            (in_stack_fffffffffffffd20,
             (Line3<float> *)
             CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar3,CONCAT13(uVar2,CONCAT12(
                                                  uVar1,in_stack_fffffffffffffd18)))))));
  local_55 = Imath_3_2::intersects<float>
                       (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                        in_stack_fffffffffffffd98);
  if (((local_55 ^ 0xff) & 1) == 0) {
    __assert_fail("!b",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                  ,0x307,"void (anonymous namespace)::rayBoxIntersection2()");
  }
  testPerturbedRayBox(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                      (bool)in_stack_fffffffffffffd77);
  Imath_3_2::Vec3<float>::Vec3((Vec3<float> *)&stack0xfffffffffffffd2c,2e+15,0.0,2e+15);
  Imath_3_2::Vec3<float>::Vec3((Vec3<float> *)&stack0xfffffffffffffd20,2e+15,0.0,-2e+15);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             &in_stack_fffffffffffffd20->pos);
  Imath_3_2::Line3<float>::operator=
            (in_stack_fffffffffffffd20,
             (Line3<float> *)
             CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar3,CONCAT13(uVar2,CONCAT12(
                                                  uVar1,in_stack_fffffffffffffd18)))))));
  local_55 = Imath_3_2::intersects<float>
                       (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                        in_stack_fffffffffffffd98);
  if (((local_55 ^ 0xff) & 1) == 0) {
    __assert_fail("!b",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                  ,0x30c,"void (anonymous namespace)::rayBoxIntersection2()");
  }
  testPerturbedRayBox(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                      (bool)in_stack_fffffffffffffd77);
  return;
}

Assistant:

void
rayBoxIntersection2 ()
{

    cout << "  ray-box intersection, nearly axis-parallel rays" << endl;

    Box3f  box (V3f (-1e15f, -1e15f, -1e15f), V3f (1e15f, 1e15f, 1e15f));
    Line3f ray;
    V3f    ip;
    bool   b;

    ray = Line3f (V3f (-2e15f, 0, 0), V3f (2e15f, 0, 0));
    b   = intersects (box, ray, ip);
    assert (b && ip == V3f (-1e15f, 0, 0));
    testPerturbedRayBox (box, ray, true);

    ray = Line3f (V3f (2e15f, 0, 0), V3f (-2e15f, 0, 0));
    b   = intersects (box, ray, ip);
    assert (b && ip == V3f (1e15f, 0, 0));
    testPerturbedRayBox (box, ray, true);

    ray = Line3f (V3f (-2e15f, 2e15f, 0), V3f (2e15f, 2e15f, 0));
    b   = intersects (box, ray, ip);
    assert (!b);
    testPerturbedRayBox (box, ray, false);

    ray = Line3f (V3f (2e15f, 2e15f, 0), V3f (-2e15f, 2e15f, 0));
    b   = intersects (box, ray, ip);
    assert (!b);
    testPerturbedRayBox (box, ray, false);

    ray = Line3f (V3f (0, -2e15f, 0), V3f (0, 2e15f, 0));
    b   = intersects (box, ray, ip);
    assert (b && ip == V3f (0, -1e15f, 0));
    testPerturbedRayBox (box, ray, true);

    ray = Line3f (V3f (0, 2e15f, 0), V3f (0, -2e15f, 0));
    b   = intersects (box, ray, ip);
    assert (b && ip == V3f (0, 1e15f, 0));
    testPerturbedRayBox (box, ray, true);

    ray = Line3f (V3f (0, -2e15f, 2e15f), V3f (0, 2e15f, 2e15f));
    b   = intersects (box, ray, ip);
    assert (!b);
    testPerturbedRayBox (box, ray, false);

    ray = Line3f (V3f (0, 2e15f, 2e15f), V3f (0, -2e15f, 2e15f));
    b   = intersects (box, ray, ip);
    assert (!b);
    testPerturbedRayBox (box, ray, false);

    ray = Line3f (V3f (0, 0, -2e15f), V3f (0, 0, 2e15f));
    b   = intersects (box, ray, ip);
    assert (b && ip == V3f (0, 0, -1e15f));
    testPerturbedRayBox (box, ray, true);

    ray = Line3f (V3f (0, 0, 2e15f), V3f (0, 0, -2e15f));
    b   = intersects (box, ray, ip);
    assert (b && ip == V3f (0, 0, 1e15f));
    testPerturbedRayBox (box, ray, true);

    ray = Line3f (V3f (2e15f, 0, -2e15f), V3f (2e15f, 0, 2e15f));
    b   = intersects (box, ray, ip);
    assert (!b);
    testPerturbedRayBox (box, ray, false);

    ray = Line3f (V3f (2e15f, 0, 2e15f), V3f (2e15f, 0, -2e15f));
    b   = intersects (box, ray, ip);
    assert (!b);
    testPerturbedRayBox (box, ray, false);
}